

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spivotL.c
# Opt level: O3

int spivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int_t iVar5;
  flops_t *pfVar6;
  void *pvVar7;
  int_t *piVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  
  pfVar6 = stat->ops;
  pvVar7 = Glu->lusup;
  iVar11 = Glu->xsup[Glu->supno[jcol]];
  iVar2 = Glu->xlsub[iVar11];
  iVar14 = Glu->xlsub[(long)iVar11 + 1] - iVar2;
  iVar3 = Glu->xlusup[iVar11];
  iVar4 = Glu->xlusup[jcol];
  piVar8 = Glu->lsub;
  iVar15 = jcol - iVar11;
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  if (iVar14 - iVar15 == 0 || iVar14 < iVar15) {
LAB_001097fa:
    *usepr = 0;
    return jcol + 1;
  }
  uVar17 = (ulong)iVar15;
  uVar13 = 0xffffffff;
  fVar19 = 0.0;
  iVar10 = iVar15;
  iVar16 = iVar15;
  do {
    fVar18 = ABS(*(float *)((long)pvVar7 + uVar17 * 4 + (long)iVar4 * 4));
    if (fVar19 < fVar18) {
      iVar10 = (int)uVar17;
    }
    if ((*usepr != 0) && (piVar8[(long)iVar2 + uVar17] == *pivrow)) {
      iVar16 = (int)uVar17;
    }
    if (piVar8[(long)iVar2 + uVar17] == iperm_c[jcol]) {
      uVar13 = uVar17 & 0xffffffff;
    }
    if (fVar18 <= fVar19) {
      fVar18 = fVar19;
    }
    uVar17 = uVar17 + 1;
    fVar19 = fVar18;
  } while ((long)uVar17 < (long)iVar14);
  if ((fVar18 == 0.0) && (!NAN(fVar18))) goto LAB_001097fa;
  if (*usepr != 0) {
    fVar19 = *(float *)((long)pvVar7 + (long)iVar16 * 4 + (long)iVar4 * 4);
    if (((fVar19 != 0.0) || (NAN(fVar19))) && ((float)((double)fVar18 * u) <= ABS(fVar19))) {
      iVar10 = *pivrow;
      goto LAB_0010987e;
    }
    *usepr = 0;
  }
  iVar16 = iVar10;
  if (-1 < (int)uVar13) {
    fVar19 = *(float *)((long)pvVar7 + uVar13 * 4 + (long)iVar4 * 4);
    iVar12 = (int)uVar13;
    if (ABS(fVar19) < (float)((double)fVar18 * u)) {
      iVar12 = iVar10;
    }
    if (fVar19 != 0.0) {
      iVar10 = iVar12;
    }
    iVar16 = iVar10;
    if (NAN(fVar19)) {
      iVar16 = iVar12;
    }
  }
  iVar10 = piVar8[(long)iVar2 + (long)iVar16];
  *pivrow = iVar10;
LAB_0010987e:
  perm_r[iVar10] = jcol;
  if (iVar16 != iVar15) {
    iVar5 = piVar8[(long)iVar2 + (long)iVar16];
    piVar8[(long)iVar2 + (long)iVar16] = piVar8[(long)iVar2 + (long)iVar15];
    piVar8[(long)iVar2 + (long)iVar15] = iVar5;
    if (-1 < iVar15) {
      uVar13 = (ulong)((jcol - iVar11) + 1);
      iVar11 = iVar15;
      do {
        uVar1 = *(undefined4 *)((long)pvVar7 + (long)iVar16 * 4 + (long)iVar3 * 4);
        *(undefined4 *)((long)pvVar7 + (long)iVar16 * 4 + (long)iVar3 * 4) =
             *(undefined4 *)((long)pvVar7 + (long)iVar11 * 4 + (long)iVar3 * 4);
        *(undefined4 *)((long)pvVar7 + (long)iVar11 * 4 + (long)iVar3 * 4) = uVar1;
        iVar11 = iVar11 + iVar14;
        iVar16 = iVar16 + iVar14;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
  }
  pfVar6[7] = (float)(iVar14 - iVar15) + pfVar6[7];
  if (iVar14 <= iVar15 + 1) {
    return 0;
  }
  fVar19 = *(float *)((long)pvVar7 + (long)iVar15 * 4 + (long)iVar4 * 4);
  lVar9 = (long)(iVar15 + 1);
  do {
    *(float *)((long)pvVar7 + lVar9 * 4 + (long)iVar4 * 4) =
         *(float *)((long)pvVar7 + lVar9 * 4 + (long)iVar4 * 4) * (1.0 / fVar19);
    lVar9 = lVar9 + 1;
  } while (lVar9 < iVar14);
  return 0;
}

Assistant:

int
spivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    float       pivmax, rtemp, thresh;
    float       temp;
    float       *lu_sup_ptr; 
    float       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    float       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (float *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
	rtemp = fabs (lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = fabs (lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
	    rtemp = fabs (lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += nsupr - nsupc;

    temp = 1.0 / lu_col_ptr[nsupc];
    for (k = nsupc+1; k < nsupr; k++) 
	lu_col_ptr[k] *= temp;

    return 0;
}